

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codepage.cpp
# Opt level: O2

string * __thiscall
booster::locale::conv::impl::normalize_encoding_abi_cxx11_
          (string *__return_storage_ptr__,impl *this,char *ccharset)

{
  impl iVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  strlen((char *)this);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  while (iVar1 = *this, iVar1 != (impl)0x0) {
    this = this + 1;
    if (((byte)((char)iVar1 + 0x9fU) < 0x1a || (byte)((char)iVar1 - 0x30U) < 10) ||
       ((byte)((char)iVar1 + 0xbfU) < 0x1a)) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string normalize_encoding(char const *ccharset)
                {
                    std::string charset;
                    charset.reserve(std::strlen(ccharset));
                    while(*ccharset!=0) {
                        char c=*ccharset++;
                        if('0' <= c && c<= '9')
                            charset+=c;
                        else if('a' <=c && c <='z')
                            charset+=c;
                        else if('A' <=c && c <='Z')
                            charset+=char(c-'A'+'a');
                    }
                    return charset;
                }